

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centre_of_circle.hpp
# Opt level: O3

double boost::geometry::determinant<double>
                 (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *m)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  reference pdVar4;
  size_type i;
  permutation_matrix<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
  pm;
  double local_38;
  permutation_matrix<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  
  numeric::ublas::
  permutation_matrix<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::permutation_matrix(&local_30,m->size1_);
  sVar2 = numeric::ublas::
          lu_factorize<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::permutation_matrix<unsigned_long,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>>>
                    (m,&local_30);
  local_38 = 0.0;
  if (sVar2 == 0) {
    iVar1 = determinant_sign(&local_30);
    local_38 = (double)iVar1;
    sVar3 = m->size1_;
    if (sVar3 != 0) {
      i = 0;
      do {
        sVar3 = numeric::ublas::basic_row_major<unsigned_long,_long>::element(i,sVar3,i,m->size2_);
        pdVar4 = numeric::ublas::unbounded_array<double,_std::allocator<double>_>::operator[]
                           (&m->data_,sVar3);
        local_38 = local_38 * *pdVar4;
        i = i + 1;
        sVar3 = m->size1_;
      } while (i < sVar3);
    }
  }
  if (local_30.
      super_vector<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
      .data_.size_ != 0) {
    operator_delete(local_30.
                    super_vector<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
                    .data_.data_);
  }
  return local_38;
}

Assistant:

T determinant( boost::numeric::ublas::matrix<T> &m )
    {
        namespace bnu = boost::numeric::ublas;

        bnu::permutation_matrix<std::size_t> pm(m.size1());
        T det;
        if( bnu::lu_factorize(m, pm) )
            det = 0.0;
        else
        {
            det = determinant_sign( pm );
            for(typename boost::numeric::ublas::matrix<T>::size_type i = 0; i < m.size1(); i++)
                det *= m(i,i); // multiply by elements on diagonal
        }
        return det;
    }